

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_utils.c
# Opt level: O0

int qc_nblockque_put(QcNBlockQue *nblckQ,void *ptr)

{
  int cell;
  void **pp_data;
  int index;
  void *ptr_local;
  QcNBlockQue *nblckQ_local;
  
  if (nblckQ->with_rwlock != 0) {
    qc_thread_mutex_lock(nblckQ->mutex);
  }
  cell = qc_staticlist_get_head(&nblckQ->lst_free);
  if (cell == -99) {
    if (nblckQ->with_rwlock != 0) {
      qc_thread_mutex_unlock(nblckQ->mutex);
    }
    nblckQ_local._4_4_ = -100;
  }
  else if (cell < 0) {
    _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_utils.c"
              ,0x13e,"error happend when get from freelst");
    if (nblckQ->with_rwlock != 0) {
      qc_thread_mutex_unlock(nblckQ->mutex);
    }
    nblckQ_local._4_4_ = -1;
  }
  else {
    *(void **)((long)nblckQ->buff + (long)cell * 8) = ptr;
    nblckQ_local._4_4_ = qc_staticlist_add_tail(&nblckQ->lst_used,cell);
    if (nblckQ_local._4_4_ < 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_utils.c"
                ,0x14a,"error happend when add tail to usedlst");
      if (nblckQ->with_rwlock != 0) {
        qc_thread_mutex_unlock(nblckQ->mutex);
      }
      nblckQ_local._4_4_ = -1;
    }
    else if (nblckQ->with_rwlock != 0) {
      qc_thread_mutex_unlock(nblckQ->mutex);
    }
  }
  return nblckQ_local._4_4_;
}

Assistant:

int qc_nblockque_put(QcNBlockQue *nblckQ, void *ptr)
{
	int index;
	void **pp_data;

	if (nblckQ->with_rwlock)
		qc_thread_mutex_lock(nblckQ->mutex);

	index = qc_staticlist_get_head(&nblckQ->lst_free);
	if (QC_INVALID_INT == index)
	{
		if (nblckQ->with_rwlock)
			qc_thread_mutex_unlock(nblckQ->mutex);
		return QC_FULLED;
	}
	else if (index < 0)
	{
		qc_error("error happend when get from freelst");
		if (nblckQ->with_rwlock)
			qc_thread_mutex_unlock(nblckQ->mutex);
		return -1;
	}

	pp_data = nblckQ->buff;
	pp_data[index] = ptr;

	index = qc_staticlist_add_tail(&nblckQ->lst_used, index);
	if (index < 0)
	{
		qc_error("error happend when add tail to usedlst");
		if (nblckQ->with_rwlock)
			qc_thread_mutex_unlock(nblckQ->mutex);
		return -1;
	}

	if (nblckQ->with_rwlock)
		qc_thread_mutex_unlock(nblckQ->mutex);

	return index;
}